

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  uint uVar1;
  ZSTD_matchState_t *pZVar2;
  seqStore_t *seqStorePtr;
  U32 UVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  int iVar8;
  uint uVar9;
  BYTE *pBVar10;
  BYTE *pBVar11;
  ulong uVar12;
  long lVar13;
  int *piVar14;
  int *piVar15;
  int iVar16;
  int *ip;
  int *ip_00;
  int *piVar17;
  U32 local_e0;
  U32 local_dc;
  size_t offset2;
  BYTE *local_c0;
  BYTE *local_b8;
  BYTE *local_b0;
  ZSTD_matchState_t *local_a8;
  size_t local_a0;
  int *local_98;
  int local_8c;
  int local_88;
  int local_84;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  seqStore_t *local_68;
  U32 *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  int *local_40;
  ulong local_38;
  
  local_b8 = (ms->window).base;
  uVar1 = (ms->window).dictLimit;
  local_c0 = local_b8 + uVar1;
  local_e0 = *rep;
  pZVar2 = ms->dictMatchState;
  local_b0 = (pZVar2->window).nextSrc;
  local_78 = (pZVar2->window).base;
  local_70 = local_78 + (pZVar2->window).dictLimit;
  iVar16 = (int)local_b0;
  local_38 = (ulong)(((int)local_78 - iVar16) + uVar1);
  local_dc = rep[1];
  ms->nextToUpdate3 = ms->nextToUpdate;
  iVar8 = (int)local_b8;
  local_84 = (1 - uVar1) - iVar8;
  iEnd = (BYTE *)(srcSize + (long)src);
  local_98 = (int *)((long)src + (srcSize - 8));
  local_80 = local_78 + -local_38;
  local_8c = -iVar8;
  local_88 = (((iVar16 - uVar1) - (int)local_78) - iVar8) + 1;
  ip = (int *)((ulong)(((int)src - (int)local_c0) + iVar16 == (int)local_70) + (long)src);
  local_68 = seqStore;
  local_60 = rep;
  do {
    while( true ) {
      if (local_98 <= ip) {
        *local_60 = local_e0;
        local_60[1] = local_dc;
        return (long)iEnd - (long)src;
      }
      iVar8 = (int)ip;
      uVar4 = ((iVar8 - (int)local_b8) - local_e0) + 1;
      piVar17 = (int *)(local_b8 + uVar4);
      if (uVar4 < uVar1) {
        piVar17 = (int *)(local_78 + (uVar4 - (int)local_38));
      }
      if ((uVar4 - uVar1 < 0xfffffffd) && (*piVar17 == *(int *)((long)ip + 1))) {
        pBVar10 = iEnd;
        if (uVar4 < uVar1) {
          pBVar10 = local_b0;
        }
        sVar5 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)(piVar17 + 1),iEnd,pBVar10,local_c0);
        uVar12 = sVar5 + 4;
      }
      else {
        uVar12 = 0;
      }
      offset2 = 999999999;
      sVar5 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS(ms,(BYTE *)ip,iEnd,&offset2);
      uVar7 = uVar12;
      if (uVar12 < sVar5) {
        uVar7 = sVar5;
      }
      if (3 < uVar7) break;
      ip = (int *)((long)ip + ((long)ip - (long)src >> 8) + 1);
    }
    piVar17 = ip;
    sVar6 = offset2;
    if (sVar5 <= uVar12) {
      piVar17 = (int *)((long)ip + 1);
      sVar6 = 0;
    }
    local_48 = (ulong)((local_84 - local_e0) + iVar8);
    local_50 = (ulong)((local_8c - local_e0) + iVar8);
    local_58 = (ulong)((local_88 - local_e0) + iVar8);
    piVar15 = ip;
    local_a8 = ms;
    for (lVar13 = 0; sVar5 = uVar7, (int *)((long)ip + lVar13) < local_98; lVar13 = lVar13 + 1) {
      ip_00 = (int *)((long)ip + lVar13 + 1);
      iVar8 = (int)lVar13;
      uVar4 = (int)local_50 + iVar8 + 1;
      piVar14 = (int *)(local_b8 + uVar4);
      if (uVar4 < uVar1) {
        piVar14 = (int *)(local_78 + (uint)((int)local_58 + iVar8));
      }
      local_a0 = sVar6;
      local_40 = piVar15;
      if (((uint)((int)local_48 + iVar8) < 0xfffffffd) && (*piVar14 == *ip_00)) {
        pBVar10 = iEnd;
        if (uVar4 < uVar1) {
          pBVar10 = local_b0;
        }
        sVar6 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + lVar13 + 5),(BYTE *)(piVar14 + 1),iEnd,pBVar10,
                           local_c0);
        if (sVar6 < 0xfffffffffffffffc) {
          uVar9 = (int)local_a0 + 1;
          uVar4 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar4 == 0; uVar4 = uVar4 - 1) {
            }
          }
          if ((int)((uVar4 ^ 0x1f) + (int)uVar7 * 3 + -0x1e) < (int)(sVar6 + 4) * 3) {
            local_a0 = 0;
            piVar17 = ip_00;
            sVar5 = sVar6 + 4;
          }
        }
      }
      offset2 = 999999999;
      uVar7 = ZSTD_HcFindBestMatch_dictMatchState_selectMLS(local_a8,(BYTE *)ip_00,iEnd,&offset2);
      sVar6 = local_a0;
      if (uVar7 < 4) break;
      uVar9 = (int)local_a0 + 1;
      uVar4 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar9 = (int)offset2 + 1;
      iVar8 = 0x1f;
      if (uVar9 != 0) {
        for (; uVar9 >> iVar8 == 0; iVar8 = iVar8 + -1) {
        }
      }
      if ((int)uVar7 * 4 - iVar8 <= (int)((uVar4 ^ 0x1f) + (int)sVar5 * 4 + -0x1b)) break;
      piVar15 = (int *)((long)local_40 + 1);
      sVar6 = offset2;
      piVar17 = piVar15;
    }
    seqStorePtr = local_68;
    ms = local_a8;
    if (sVar6 == 0) {
      sVar6 = 0;
    }
    else {
      uVar12 = (long)piVar17 + (-(long)local_b8 - sVar6) + -0xfffffffe;
      pBVar11 = local_b8;
      pBVar10 = local_c0;
      if ((uint)uVar12 < uVar1) {
        pBVar11 = local_80;
        pBVar10 = local_70;
      }
      pBVar11 = pBVar11 + (uVar12 & 0xffffffff);
      for (; ((src < piVar17 && (pBVar10 < pBVar11)) &&
             (*(BYTE *)((long)piVar17 + -1) == pBVar11[-1])); piVar17 = (int *)((long)piVar17 + -1))
      {
        pBVar11 = pBVar11 + -1;
        sVar5 = sVar5 + 1;
      }
      local_dc = local_e0;
      local_e0 = (int)sVar6 - 2;
    }
    ZSTD_storeSeq(local_68,(long)piVar17 - (long)src,src,(U32)sVar6,sVar5 - 3);
    UVar3 = local_dc;
    for (src = (void *)((long)piVar17 + sVar5); local_dc = UVar3, ip = (int *)src, src <= local_98;
        src = (void *)((long)src + sVar5 + 4)) {
      uVar4 = ((int)src - (int)local_b8) - local_dc;
      pBVar10 = local_b8;
      if (uVar4 < uVar1) {
        pBVar10 = local_80;
      }
      if ((0xfffffffc < uVar4 - uVar1) || (*(int *)(pBVar10 + uVar4) != *src)) break;
      pBVar11 = iEnd;
      if (uVar4 < uVar1) {
        pBVar11 = local_b0;
      }
      sVar5 = ZSTD_count_2segments
                        ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar10 + uVar4) + 4),iEnd,pBVar11,
                         local_c0);
      ZSTD_storeSeq(seqStorePtr,0,src,0,sVar5 + 1);
      UVar3 = local_e0;
      local_e0 = local_dc;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, 0, 1, ZSTD_dictMatchState);
}